

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.h
# Opt level: O3

void __thiscall bignum_t<32>::set(bignum_t<32> *this,vm_val_t *val)

{
  vm_datatype_t vVar1;
  int iVar2;
  double val_00;
  
  vVar1 = val->typ;
  if (vVar1 == VM_OBJ) {
    iVar2 = (**(code **)(*(long *)&G_obj_table_X.pages_[(val->val).obj >> 0xc]
                                   [(val->val).obj & 0xfff].ptr_ + 8))
                      (G_obj_table_X.pages_[(val->val).obj >> 0xc] + ((val->val).obj & 0xfff),
                       CVmObjBigNum::metaclass_reg_);
    if (iVar2 != 0) {
      if (G_obj_table_X.pages_[(val->val).obj >> 0xc] != (CVmObjPageEntry *)0x0) {
        CVmObjBigNum::copy_val
                  (this->ext,
                   *(char **)((long)&G_obj_table_X.pages_[(val->val).obj >> 0xc]
                                     [(val->val).obj & 0xfff].ptr_ + 8),1);
        return;
      }
    }
    vVar1 = val->typ;
  }
  else if (vVar1 == VM_INT) {
    CVmObjBigNum::set_int_val(this->ext,(long)(val->val).intval);
    return;
  }
  if (vVar1 != VM_INT) {
    iVar2 = vm_val_t::nonint_is_numeric(val);
    if (iVar2 == 0) {
      err_throw(0x7d4);
    }
    if (val->typ != VM_INT) {
      val_00 = vm_val_t::nonint_num_to_double(val);
      goto LAB_0028b2a5;
    }
  }
  val_00 = (double)(val->val).intval;
LAB_0028b2a5:
  CVmObjBigNum::set_double_val(this->ext,val_00);
  return;
}

Assistant:

void set(VMG_ const vm_val_t *val)
    {
        CVmObjBigNum *b;
        if (val->typ == VM_INT)
            CVmObjBigNum::set_int_val(ext, val->val.intval);
        else if ((b = vm_val_cast(CVmObjBigNum, val)) != 0)
            CVmObjBigNum::copy_val(ext, b->get_ext(), TRUE);
        else if (val->is_numeric(vmg0_))
            CVmObjBigNum::set_double_val(ext, val->num_to_double(vmg0_));
        else
            err_throw(VMERR_NUM_VAL_REQD);
    }